

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

void al_draw_textf(ALLEGRO_FONT *font,ALLEGRO_COLOR color,float x,float y,int flags,char *format,...
                  )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char in_AL;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ALLEGRO_USTR *pAVar6;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ALLEGRO_COLOR color_00;
  ALLEGRO_COLOR color_01;
  va_list ap;
  ALLEGRO_USTR_INFO info;
  undefined8 local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_f8._8_4_ = in_XMM1_Dc;
  local_f8._0_8_ = color._8_8_;
  local_f8._12_4_ = in_XMM1_Dd;
  local_108._8_4_ = in_XMM0_Dc;
  local_108._0_8_ = color._0_8_;
  local_108._12_4_ = in_XMM0_Dd;
  if (in_AL != '\0') {
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  iVar3 = strcmp(format,"%s");
  local_128 = 0x7000000018;
  local_120 = &stack0x00000008;
  local_118 = local_d8;
  if (iVar3 == 0) {
    local_128 = 0x7000000020;
    pAVar6 = (ALLEGRO_USTR *)al_ref_cstr(local_e8,local_c0);
    auVar2 = local_f8;
    auVar1 = local_108;
    color_01.b = (float)local_f8._0_4_;
    color_01.a = (float)local_f8._4_4_;
    color_01.r = (float)local_108._0_4_;
    color_01.g = (float)local_108._4_4_;
    local_108 = auVar1;
    local_f8 = auVar2;
    al_draw_ustr(font,color_01,x,y,flags,pAVar6);
  }
  else {
    uVar4 = al_ustr_new("");
    al_ustr_vappendf(uVar4,format,&local_128);
    uVar5 = al_cstr(uVar4);
    pAVar6 = (ALLEGRO_USTR *)al_ref_cstr(local_e8,uVar5);
    auVar2 = local_f8;
    auVar1 = local_108;
    color_00.b = (float)local_f8._0_4_;
    color_00.a = (float)local_f8._4_4_;
    color_00.r = (float)local_108._0_4_;
    color_00.g = (float)local_108._4_4_;
    local_108 = auVar1;
    local_f8 = auVar2;
    al_draw_ustr(font,color_00,x,y,flags,pAVar6);
    al_ustr_free(uVar4);
  }
  return;
}

Assistant:

void al_draw_textf(const ALLEGRO_FONT *font, ALLEGRO_COLOR color,
   float x, float y, int flags,
   const char *format, ...)
{
   ALLEGRO_USTR *buf;
   va_list ap;
   const char *s;
   ASSERT(font);
   ASSERT(format);

   /* Fast path for common case. */
   if (0 == strcmp(format, "%s")) {
      va_start(ap, format);
      s = va_arg(ap, const char *);
      al_draw_text(font, color, x, y, flags, s);
      va_end(ap);
      return;
   }

   va_start(ap, format);
   buf = al_ustr_new("");
   al_ustr_vappendf(buf, format, ap);
   va_end(ap);

   al_draw_text(font, color, x, y, flags, al_cstr(buf));

   al_ustr_free(buf);
}